

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

value_type __thiscall
andres::
BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
::operator()(BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
             *this,int it)

{
  reference psVar1;
  reference psVar2;
  
  psVar1 = View<short,false,std::allocator<unsigned_long>>::operator()
                     (*(View<short,false,std::allocator<unsigned_long>> **)this,it);
  psVar2 = View<short,false,std::allocator<unsigned_long>>::operator()
                     (*(View<short,false,std::allocator<unsigned_long>> **)(this + 8),it);
  return *psVar2 + *psVar1;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }